

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O1

void __thiscall dg::BBlock<dg::LLVMNode>::removeSuccessors(BBlock<dg::LLVMNode> *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>_*>,_std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>_*>_>
  pVar4;
  BBlock<dg::LLVMNode> *local_30;
  
  p_Var3 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      lVar2 = *(long *)(p_Var3 + 1);
      local_30 = this;
      pVar4 = std::
              _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
              ::equal_range((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                             *)(lVar2 + 0x58),&local_30);
      std::
      _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
      ::_M_erase_aux((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                      *)(lVar2 + 0x58),(_Base_ptr)pVar4.first._M_node,
                     (_Base_ptr)pVar4.second._M_node);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
  ::_M_erase((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
              *)&this->nextBBs,
             (_Link_type)
             (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

void removeSuccessors() {
        // remove references to this node from successors
        for (const BBlockEdge &succ : nextBBs) {
            // This assertion does not hold anymore, since if we have
            // two edges with different labels to the same successor,
            // and we remove the successor, then we remove 'this'
            // from prevBBs twice. If we'll add labels even to predecessors,
            // this assertion must hold again
            // bool ret = succ.target->prevBBs.erase(this);
            // assert(ret && "Did not have this BB in successor's pred");
            succ.target->prevBBs.erase(this);
        }

        nextBBs.clear();
    }